

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<8,_1048576,_false,_embree::avx::ArrayIntersector1<embree::avx::QuadMiIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  ulong uVar2;
  float **ppfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  Geometry *pGVar8;
  RTCIntersectArguments *pRVar9;
  RTCRayQueryContext *pRVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [32];
  float fVar19;
  float fVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 (*pauVar61) [16];
  int iVar62;
  uint uVar63;
  uint uVar64;
  ulong *puVar65;
  long lVar66;
  undefined1 (*pauVar67) [16];
  ulong uVar68;
  long lVar69;
  undefined1 (*pauVar70) [16];
  ulong uVar71;
  long lVar72;
  ulong uVar73;
  ulong uVar74;
  ulong uVar75;
  ulong uVar76;
  undefined4 uVar77;
  ulong unaff_R13;
  size_t mask;
  undefined1 auVar78 [32];
  undefined1 auVar79 [64];
  float fVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  float fVar94;
  undefined1 auVar88 [16];
  float fVar96;
  float fVar97;
  float fVar99;
  undefined1 auVar90 [32];
  undefined1 auVar89 [16];
  undefined1 auVar91 [32];
  float fVar95;
  float fVar98;
  float fVar100;
  float fVar101;
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  float fVar102;
  float fVar115;
  float fVar116;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar108 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar107 [16];
  float fVar117;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  float fVar121;
  float fVar128;
  float fVar129;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar131;
  float fVar132;
  float fVar133;
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  float fVar130;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  float fVar134;
  float fVar135;
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  float fVar149;
  float fVar156;
  float fVar157;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar159;
  float fVar160;
  float fVar161;
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  float fVar158;
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  float fVar166;
  float fVar167;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  float fVar184;
  float fVar191;
  float fVar192;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar194;
  float fVar195;
  float fVar196;
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  float fVar193;
  float fVar197;
  undefined1 auVar190 [32];
  float fVar198;
  float fVar203;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  float fVar204;
  float fVar207;
  float fVar208;
  undefined1 auVar205 [16];
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  undefined1 auVar206 [32];
  float fVar213;
  float fVar214;
  undefined1 auVar215 [32];
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  undefined1 auVar216 [64];
  undefined1 auVar229 [32];
  undefined1 auVar230 [64];
  undefined1 auVar231 [32];
  undefined1 auVar232 [64];
  float fVar233;
  float fVar234;
  undefined1 auVar235 [32];
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  undefined1 auVar236 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  int local_291c;
  ulong local_2918;
  RTCFilterFunctionNArguments local_2910;
  undefined1 local_28e0 [32];
  undefined1 (*local_28c0) [16];
  long local_28b8;
  Scene *local_28b0;
  ulong local_28a8;
  ulong local_28a0;
  ulong local_2898;
  float local_2890;
  float local_288c;
  float local_2888;
  undefined4 local_2884;
  undefined4 local_2880;
  undefined4 local_287c;
  uint local_2878;
  uint local_2874;
  uint local_2870;
  undefined8 local_2860;
  float fStack_2858;
  float fStack_2854;
  float fStack_2850;
  float fStack_284c;
  float fStack_2848;
  float fStack_2844;
  undefined1 local_2840 [32];
  undefined1 local_2820 [32];
  undefined8 local_2800;
  undefined8 uStack_27f8;
  undefined8 uStack_27f0;
  undefined8 uStack_27e8;
  undefined1 local_27e0 [12];
  float fStack_27d4;
  float fStack_27d0;
  float fStack_27cc;
  float fStack_27c8;
  float fStack_27c4;
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  float local_26a0 [4];
  float fStack_2690;
  float fStack_268c;
  float fStack_2688;
  undefined4 uStack_2684;
  float local_2680 [4];
  float fStack_2670;
  float fStack_266c;
  float fStack_2668;
  undefined4 uStack_2664;
  float local_2660 [4];
  float fStack_2650;
  float fStack_264c;
  float fStack_2648;
  undefined4 uStack_2644;
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined8 local_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_2398 = 0;
    if (local_23a0 != 8) {
      local_28c0 = (undefined1 (*) [16])local_2390;
      auVar108 = vmaxss_avx(ZEXT816(0) << 0x40,
                            ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar88 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      aVar1 = (ray->super_RayK<1>).dir.field_0;
      auVar83._8_4_ = 0x7fffffff;
      auVar83._0_8_ = 0x7fffffff7fffffff;
      auVar83._12_4_ = 0x7fffffff;
      auVar83 = vandps_avx((undefined1  [16])aVar1,auVar83);
      auVar136._8_4_ = 0x219392ef;
      auVar136._0_8_ = 0x219392ef219392ef;
      auVar136._12_4_ = 0x219392ef;
      auVar83 = vcmpps_avx(auVar83,auVar136,1);
      auVar83 = vblendvps_avx((undefined1  [16])aVar1,auVar136,auVar83);
      auVar136 = vrcpps_avx(auVar83);
      fVar121 = auVar136._0_4_;
      auVar103._0_4_ = auVar83._0_4_ * fVar121;
      fVar128 = auVar136._4_4_;
      auVar103._4_4_ = auVar83._4_4_ * fVar128;
      fVar19 = auVar136._8_4_;
      auVar103._8_4_ = auVar83._8_4_ * fVar19;
      fVar20 = auVar136._12_4_;
      auVar103._12_4_ = auVar83._12_4_ * fVar20;
      auVar137._8_4_ = 0x3f800000;
      auVar137._0_8_ = &DAT_3f8000003f800000;
      auVar137._12_4_ = 0x3f800000;
      auVar83 = vsubps_avx(auVar137,auVar103);
      uVar77 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
      local_25c0._4_4_ = uVar77;
      local_25c0._0_4_ = uVar77;
      local_25c0._8_4_ = uVar77;
      local_25c0._12_4_ = uVar77;
      local_25c0._16_4_ = uVar77;
      local_25c0._20_4_ = uVar77;
      local_25c0._24_4_ = uVar77;
      local_25c0._28_4_ = uVar77;
      auVar216 = ZEXT3264(local_25c0);
      uVar77 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
      local_25e0._4_4_ = uVar77;
      local_25e0._0_4_ = uVar77;
      local_25e0._8_4_ = uVar77;
      local_25e0._12_4_ = uVar77;
      local_25e0._16_4_ = uVar77;
      local_25e0._20_4_ = uVar77;
      local_25e0._24_4_ = uVar77;
      local_25e0._28_4_ = uVar77;
      auVar230 = ZEXT3264(local_25e0);
      auVar104._0_4_ = fVar121 + fVar121 * auVar83._0_4_;
      auVar104._4_4_ = fVar128 + fVar128 * auVar83._4_4_;
      auVar104._8_4_ = fVar19 + fVar19 * auVar83._8_4_;
      auVar104._12_4_ = fVar20 + fVar20 * auVar83._12_4_;
      uVar77 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
      local_2600._4_4_ = uVar77;
      local_2600._0_4_ = uVar77;
      local_2600._8_4_ = uVar77;
      local_2600._12_4_ = uVar77;
      local_2600._16_4_ = uVar77;
      local_2600._20_4_ = uVar77;
      local_2600._24_4_ = uVar77;
      local_2600._28_4_ = uVar77;
      auVar232 = ZEXT3264(local_2600);
      auVar83 = vshufps_avx(auVar104,auVar104,0);
      local_2620._16_16_ = auVar83;
      local_2620._0_16_ = auVar83;
      auVar236 = ZEXT3264(local_2620);
      auVar83 = vmovshdup_avx(auVar104);
      auVar136 = vshufps_avx(auVar104,auVar104,0x55);
      local_2540._16_16_ = auVar136;
      local_2540._0_16_ = auVar136;
      auVar136 = vshufpd_avx(auVar104,auVar104,1);
      auVar103 = vshufps_avx(auVar104,auVar104,0xaa);
      local_2560._16_16_ = auVar103;
      local_2560._0_16_ = auVar103;
      auVar108 = vshufps_avx(auVar108,auVar108,0);
      local_2580._16_16_ = auVar108;
      local_2580._0_16_ = auVar108;
      auVar108 = vshufps_avx(auVar88,auVar88,0);
      auVar79 = ZEXT3264(CONCAT1616(auVar108,auVar108));
      uVar68 = (ulong)(auVar104._0_4_ < 0.0) * 8;
      uVar73 = uVar68 ^ 8;
      uVar74 = (ulong)((uint)(auVar83._0_4_ < 0.0) * 8 + 0x10);
      local_2898 = uVar74 ^ 8;
      local_28a0 = (ulong)((uint)(auVar136._0_4_ < 0.0) * 8 + 0x20);
      local_28a8 = local_28a0 ^ 8;
      local_25a0 = mm_lookupmask_ps._0_8_;
      uStack_2598 = mm_lookupmask_ps._8_8_;
      uStack_2590 = mm_lookupmask_ps._240_8_;
      uStack_2588 = mm_lookupmask_ps._248_8_;
      do {
        do {
          do {
            if (local_28c0 == (undefined1 (*) [16])&local_23a0) {
              return;
            }
            pauVar61 = local_28c0 + -1;
            local_28c0 = local_28c0 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)(*pauVar61 + 8));
          uVar76 = *(ulong *)*local_28c0;
          do {
            if ((uVar76 & 8) == 0) {
              puVar65 = (ulong *)((uVar76 & 0xfffffffffffffff0) + 0x40);
              if ((uVar76 & 0xfffffffffffffff0) == 0) {
                puVar65 = (ulong *)0x0;
              }
              auVar108._8_8_ = 0;
              auVar108._0_8_ = *puVar65;
              auVar105._8_8_ = 0;
              auVar105._0_8_ = puVar65[1];
              auVar83 = vpminub_avx(auVar108,auVar105);
              auVar83 = vpcmpeqb_avx(auVar108,auVar83);
              auVar88._8_8_ = 0;
              auVar88._0_8_ = *(ulong *)((long)puVar65 + 4);
              auVar122._8_8_ = 0;
              auVar122._0_8_ = *(ulong *)((long)puVar65 + 0xc);
              auVar108 = vpminub_avx(auVar88,auVar122);
              fVar121 = *(float *)(puVar65 + 6);
              auVar108 = vpcmpeqb_avx(auVar88,auVar108);
              fVar128 = *(float *)((long)puVar65 + 0x3c);
              auVar106._8_8_ = 0;
              auVar106._0_8_ = puVar65[auVar104._0_4_ < 0.0];
              auVar88 = vpmovzxbd_avx(auVar106);
              auVar150._8_8_ = 0;
              auVar150._0_8_ = *(ulong *)((long)puVar65 + uVar68 + 4);
              auVar136 = vpmovzxbd_avx(auVar150);
              auVar109._16_16_ = auVar136;
              auVar109._0_16_ = auVar88;
              auVar109 = vcvtdq2ps_avx(auVar109);
              auVar110._0_4_ = fVar121 + fVar128 * auVar109._0_4_;
              auVar110._4_4_ = fVar121 + fVar128 * auVar109._4_4_;
              auVar110._8_4_ = fVar121 + fVar128 * auVar109._8_4_;
              auVar110._12_4_ = fVar121 + fVar128 * auVar109._12_4_;
              auVar110._16_4_ = fVar121 + fVar128 * auVar109._16_4_;
              auVar110._20_4_ = fVar121 + fVar128 * auVar109._20_4_;
              auVar110._24_4_ = fVar121 + fVar128 * auVar109._24_4_;
              auVar110._28_4_ = fVar121 + auVar109._28_4_;
              auVar151._8_8_ = 0;
              auVar151._0_8_ = *(ulong *)((long)puVar65 + uVar73);
              auVar88 = vpmovzxbd_avx(auVar151);
              auVar162._8_8_ = 0;
              auVar162._0_8_ = *(ulong *)((long)puVar65 + uVar73 + 4);
              auVar136 = vpmovzxbd_avx(auVar162);
              auVar152._16_16_ = auVar136;
              auVar152._0_16_ = auVar88;
              auVar109 = vcvtdq2ps_avx(auVar152);
              fVar19 = *(float *)((long)puVar65 + 0x34);
              auVar124._0_4_ = fVar121 + fVar128 * auVar109._0_4_;
              auVar124._4_4_ = fVar121 + fVar128 * auVar109._4_4_;
              auVar124._8_4_ = fVar121 + fVar128 * auVar109._8_4_;
              auVar124._12_4_ = fVar121 + fVar128 * auVar109._12_4_;
              auVar124._16_4_ = fVar121 + fVar128 * auVar109._16_4_;
              auVar124._20_4_ = fVar121 + fVar128 * auVar109._20_4_;
              auVar124._24_4_ = fVar121 + fVar128 * auVar109._24_4_;
              auVar124._28_4_ = fVar121 + fVar128;
              fVar121 = *(float *)(puVar65 + 8);
              auVar138._8_8_ = 0;
              auVar138._0_8_ = *(ulong *)((long)puVar65 + uVar74);
              auVar88 = vpmovzxbd_avx(auVar138);
              auVar168._8_8_ = 0;
              auVar168._0_8_ = *(ulong *)((long)puVar65 + uVar74 + 4);
              auVar136 = vpmovzxbd_avx(auVar168);
              auVar139._16_16_ = auVar136;
              auVar139._0_16_ = auVar88;
              auVar109 = vcvtdq2ps_avx(auVar139);
              auVar140._0_4_ = fVar19 + fVar121 * auVar109._0_4_;
              auVar140._4_4_ = fVar19 + fVar121 * auVar109._4_4_;
              auVar140._8_4_ = fVar19 + fVar121 * auVar109._8_4_;
              auVar140._12_4_ = fVar19 + fVar121 * auVar109._12_4_;
              auVar140._16_4_ = fVar19 + fVar121 * auVar109._16_4_;
              auVar140._20_4_ = fVar19 + fVar121 * auVar109._20_4_;
              auVar140._24_4_ = fVar19 + fVar121 * auVar109._24_4_;
              auVar140._28_4_ = fVar19 + auVar109._28_4_;
              auVar169._8_8_ = 0;
              auVar169._0_8_ = *(ulong *)((long)puVar65 + local_2898);
              auVar88 = vpmovzxbd_avx(auVar169);
              auVar185._8_8_ = 0;
              auVar185._0_8_ = *(ulong *)((long)puVar65 + local_2898 + 4);
              auVar136 = vpmovzxbd_avx(auVar185);
              auVar170._16_16_ = auVar136;
              auVar170._0_16_ = auVar88;
              auVar109 = vcvtdq2ps_avx(auVar170);
              fVar128 = *(float *)(puVar65 + 7);
              auVar153._0_4_ = fVar19 + auVar109._0_4_ * fVar121;
              auVar153._4_4_ = fVar19 + auVar109._4_4_ * fVar121;
              auVar153._8_4_ = fVar19 + auVar109._8_4_ * fVar121;
              auVar153._12_4_ = fVar19 + auVar109._12_4_ * fVar121;
              auVar153._16_4_ = fVar19 + auVar109._16_4_ * fVar121;
              auVar153._20_4_ = fVar19 + auVar109._20_4_ * fVar121;
              auVar153._24_4_ = fVar19 + auVar109._24_4_ * fVar121;
              auVar153._28_4_ = fVar19 + fVar121;
              fVar121 = *(float *)((long)puVar65 + 0x44);
              auVar186._8_8_ = 0;
              auVar186._0_8_ = *(ulong *)((long)puVar65 + local_28a0);
              auVar88 = vpmovzxbd_avx(auVar186);
              auVar199._8_8_ = 0;
              auVar199._0_8_ = *(ulong *)((long)puVar65 + local_28a0 + 4);
              auVar136 = vpmovzxbd_avx(auVar199);
              auVar187._16_16_ = auVar136;
              auVar187._0_16_ = auVar88;
              auVar200._8_8_ = 0;
              auVar200._0_8_ = *(ulong *)((long)puVar65 + local_28a8);
              auVar88 = vpmovzxbd_avx(auVar200);
              auVar205._8_8_ = 0;
              auVar205._0_8_ = *(ulong *)((long)puVar65 + local_28a8 + 4);
              auVar136 = vpmovzxbd_avx(auVar205);
              auVar201._16_16_ = auVar136;
              auVar201._0_16_ = auVar88;
              auVar109 = vcvtdq2ps_avx(auVar187);
              auVar18 = vcvtdq2ps_avx(auVar201);
              auVar188._0_4_ = fVar128 + auVar109._0_4_ * fVar121;
              auVar188._4_4_ = fVar128 + auVar109._4_4_ * fVar121;
              auVar188._8_4_ = fVar128 + auVar109._8_4_ * fVar121;
              auVar188._12_4_ = fVar128 + auVar109._12_4_ * fVar121;
              auVar188._16_4_ = fVar128 + auVar109._16_4_ * fVar121;
              auVar188._20_4_ = fVar128 + auVar109._20_4_ * fVar121;
              auVar188._24_4_ = fVar128 + auVar109._24_4_ * fVar121;
              auVar188._28_4_ = fVar128 + auVar109._28_4_;
              auVar163._0_4_ = fVar128 + auVar18._0_4_ * fVar121;
              auVar163._4_4_ = fVar128 + auVar18._4_4_ * fVar121;
              auVar163._8_4_ = fVar128 + auVar18._8_4_ * fVar121;
              auVar163._12_4_ = fVar128 + auVar18._12_4_ * fVar121;
              auVar163._16_4_ = fVar128 + auVar18._16_4_ * fVar121;
              auVar163._20_4_ = fVar128 + auVar18._20_4_ * fVar121;
              auVar163._24_4_ = fVar128 + auVar18._24_4_ * fVar121;
              auVar163._28_4_ = fVar128 + fVar121;
              auVar109 = vsubps_avx(auVar110,auVar216._0_32_);
              auVar18._4_4_ = auVar236._4_4_ * auVar109._4_4_;
              auVar18._0_4_ = auVar236._0_4_ * auVar109._0_4_;
              auVar18._8_4_ = auVar236._8_4_ * auVar109._8_4_;
              auVar18._12_4_ = auVar236._12_4_ * auVar109._12_4_;
              auVar18._16_4_ = auVar236._16_4_ * auVar109._16_4_;
              auVar18._20_4_ = auVar236._20_4_ * auVar109._20_4_;
              auVar18._24_4_ = auVar236._24_4_ * auVar109._24_4_;
              auVar18._28_4_ = auVar109._28_4_;
              auVar109 = vsubps_avx(auVar140,auVar230._0_32_);
              auVar21._4_4_ = local_2540._4_4_ * auVar109._4_4_;
              auVar21._0_4_ = local_2540._0_4_ * auVar109._0_4_;
              auVar21._8_4_ = local_2540._8_4_ * auVar109._8_4_;
              auVar21._12_4_ = local_2540._12_4_ * auVar109._12_4_;
              auVar21._16_4_ = local_2540._16_4_ * auVar109._16_4_;
              auVar21._20_4_ = local_2540._20_4_ * auVar109._20_4_;
              auVar21._24_4_ = local_2540._24_4_ * auVar109._24_4_;
              auVar21._28_4_ = auVar109._28_4_;
              auVar109 = vmaxps_avx(auVar18,auVar21);
              auVar18 = vsubps_avx(auVar188,auVar232._0_32_);
              auVar22._4_4_ = local_2560._4_4_ * auVar18._4_4_;
              auVar22._0_4_ = local_2560._0_4_ * auVar18._0_4_;
              auVar22._8_4_ = local_2560._8_4_ * auVar18._8_4_;
              auVar22._12_4_ = local_2560._12_4_ * auVar18._12_4_;
              auVar22._16_4_ = local_2560._16_4_ * auVar18._16_4_;
              auVar22._20_4_ = local_2560._20_4_ * auVar18._20_4_;
              auVar22._24_4_ = local_2560._24_4_ * auVar18._24_4_;
              auVar22._28_4_ = auVar18._28_4_;
              auVar18 = vmaxps_avx(auVar22,local_2580);
              _local_27e0 = vmaxps_avx(auVar109,auVar18);
              auVar109 = vsubps_avx(auVar124,auVar216._0_32_);
              auVar23._4_4_ = auVar236._4_4_ * auVar109._4_4_;
              auVar23._0_4_ = auVar236._0_4_ * auVar109._0_4_;
              auVar23._8_4_ = auVar236._8_4_ * auVar109._8_4_;
              auVar23._12_4_ = auVar236._12_4_ * auVar109._12_4_;
              auVar23._16_4_ = auVar236._16_4_ * auVar109._16_4_;
              auVar23._20_4_ = auVar236._20_4_ * auVar109._20_4_;
              auVar23._24_4_ = auVar236._24_4_ * auVar109._24_4_;
              auVar23._28_4_ = auVar109._28_4_;
              auVar109 = vsubps_avx(auVar153,auVar230._0_32_);
              auVar24._4_4_ = local_2540._4_4_ * auVar109._4_4_;
              auVar24._0_4_ = local_2540._0_4_ * auVar109._0_4_;
              auVar24._8_4_ = local_2540._8_4_ * auVar109._8_4_;
              auVar24._12_4_ = local_2540._12_4_ * auVar109._12_4_;
              auVar24._16_4_ = local_2540._16_4_ * auVar109._16_4_;
              auVar24._20_4_ = local_2540._20_4_ * auVar109._20_4_;
              auVar24._24_4_ = local_2540._24_4_ * auVar109._24_4_;
              auVar24._28_4_ = auVar109._28_4_;
              auVar109 = vminps_avx(auVar23,auVar24);
              auVar18 = vsubps_avx(auVar163,auVar232._0_32_);
              auVar25._4_4_ = local_2560._4_4_ * auVar18._4_4_;
              auVar25._0_4_ = local_2560._0_4_ * auVar18._0_4_;
              auVar25._8_4_ = local_2560._8_4_ * auVar18._8_4_;
              auVar25._12_4_ = local_2560._12_4_ * auVar18._12_4_;
              auVar25._16_4_ = local_2560._16_4_ * auVar18._16_4_;
              auVar25._20_4_ = local_2560._20_4_ * auVar18._20_4_;
              auVar25._24_4_ = local_2560._24_4_ * auVar18._24_4_;
              auVar25._28_4_ = auVar18._28_4_;
              auVar18 = vminps_avx(auVar25,auVar79._0_32_);
              auVar18 = vminps_avx(auVar109,auVar18);
              auVar109 = vcmpps_avx(_local_27e0,auVar18,2);
              auVar88 = vpcmpeqd_avx(auVar18._0_16_,auVar18._0_16_);
              auVar83 = vpmovsxbd_avx(auVar83 ^ auVar88);
              auVar108 = vpmovsxbd_avx(auVar108 ^ auVar88);
              auVar84._16_16_ = auVar108;
              auVar84._0_16_ = auVar83;
              auVar18 = vcvtdq2ps_avx(auVar84);
              auVar90._8_4_ = 0xbf800000;
              auVar90._0_8_ = 0xbf800000bf800000;
              auVar90._12_4_ = 0xbf800000;
              auVar90._16_4_ = 0xbf800000;
              auVar90._20_4_ = 0xbf800000;
              auVar90._24_4_ = 0xbf800000;
              auVar90._28_4_ = 0xbf800000;
              auVar18 = vcmpps_avx(auVar90,auVar18,1);
              auVar109 = vandps_avx(auVar109,auVar18);
              uVar77 = vmovmskps_avx(auVar109);
              unaff_R13 = CONCAT44((int)(unaff_R13 >> 0x20),uVar77);
            }
            if ((uVar76 & 8) == 0) {
              if (unaff_R13 == 0) {
                iVar62 = 4;
              }
              else {
                uVar75 = uVar76 & 0xfffffffffffffff0;
                lVar72 = 0;
                if (unaff_R13 != 0) {
                  for (; (unaff_R13 >> lVar72 & 1) == 0; lVar72 = lVar72 + 1) {
                  }
                }
                iVar62 = 0;
                uVar76 = *(ulong *)(uVar75 + lVar72 * 8);
                uVar71 = unaff_R13 - 1 & unaff_R13;
                if (uVar71 != 0) {
                  uVar64 = *(uint *)(local_27e0 + lVar72 * 4);
                  lVar72 = 0;
                  if (uVar71 != 0) {
                    for (; (uVar71 >> lVar72 & 1) == 0; lVar72 = lVar72 + 1) {
                    }
                  }
                  uVar2 = *(ulong *)(uVar75 + lVar72 * 8);
                  uVar63 = *(uint *)(local_27e0 + lVar72 * 4);
                  uVar71 = uVar71 - 1 & uVar71;
                  if (uVar71 == 0) {
                    if (uVar64 < uVar63) {
                      *(ulong *)*local_28c0 = uVar2;
                      *(uint *)(*local_28c0 + 8) = uVar63;
                      local_28c0 = local_28c0 + 1;
                    }
                    else {
                      *(ulong *)*local_28c0 = uVar76;
                      *(uint *)(*local_28c0 + 8) = uVar64;
                      local_28c0 = local_28c0 + 1;
                      uVar76 = uVar2;
                    }
                  }
                  else {
                    auVar81._8_8_ = 0;
                    auVar81._0_8_ = uVar76;
                    auVar83 = vpunpcklqdq_avx(auVar81,ZEXT416(uVar64));
                    auVar89._8_8_ = 0;
                    auVar89._0_8_ = uVar2;
                    auVar108 = vpunpcklqdq_avx(auVar89,ZEXT416(uVar63));
                    lVar72 = 0;
                    if (uVar71 != 0) {
                      for (; (uVar71 >> lVar72 & 1) == 0; lVar72 = lVar72 + 1) {
                      }
                    }
                    auVar107._8_8_ = 0;
                    auVar107._0_8_ = *(ulong *)(uVar75 + lVar72 * 8);
                    auVar88 = vpunpcklqdq_avx(auVar107,ZEXT416(*(uint *)(local_27e0 + lVar72 * 4)));
                    uVar71 = uVar71 - 1 & uVar71;
                    if (uVar71 == 0) {
                      auVar136 = vpcmpgtd_avx(auVar108,auVar83);
                      auVar103 = vpshufd_avx(auVar136,0xaa);
                      auVar136 = vblendvps_avx(auVar108,auVar83,auVar103);
                      auVar83 = vblendvps_avx(auVar83,auVar108,auVar103);
                      auVar108 = vpcmpgtd_avx(auVar88,auVar136);
                      auVar103 = vpshufd_avx(auVar108,0xaa);
                      auVar108 = vblendvps_avx(auVar88,auVar136,auVar103);
                      auVar88 = vblendvps_avx(auVar136,auVar88,auVar103);
                      auVar136 = vpcmpgtd_avx(auVar88,auVar83);
                      auVar103 = vpshufd_avx(auVar136,0xaa);
                      auVar136 = vblendvps_avx(auVar88,auVar83,auVar103);
                      auVar83 = vblendvps_avx(auVar83,auVar88,auVar103);
                      *local_28c0 = auVar83;
                      local_28c0[1] = auVar136;
                      uVar76 = auVar108._0_8_;
                      local_28c0 = local_28c0 + 2;
                    }
                    else {
                      lVar72 = 0;
                      if (uVar71 != 0) {
                        for (; (uVar71 >> lVar72 & 1) == 0; lVar72 = lVar72 + 1) {
                        }
                      }
                      auVar123._8_8_ = 0;
                      auVar123._0_8_ = *(ulong *)(uVar75 + lVar72 * 8);
                      auVar136 = vpunpcklqdq_avx(auVar123,ZEXT416(*(uint *)(local_27e0 + lVar72 * 4)
                                                                 ));
                      uVar71 = uVar71 - 1 & uVar71;
                      if (uVar71 == 0) {
                        auVar103 = vpcmpgtd_avx(auVar108,auVar83);
                        auVar137 = vpshufd_avx(auVar103,0xaa);
                        auVar103 = vblendvps_avx(auVar108,auVar83,auVar137);
                        auVar83 = vblendvps_avx(auVar83,auVar108,auVar137);
                        auVar108 = vpcmpgtd_avx(auVar136,auVar88);
                        auVar137 = vpshufd_avx(auVar108,0xaa);
                        auVar108 = vblendvps_avx(auVar136,auVar88,auVar137);
                        auVar88 = vblendvps_avx(auVar88,auVar136,auVar137);
                        auVar136 = vpcmpgtd_avx(auVar88,auVar83);
                        auVar137 = vpshufd_avx(auVar136,0xaa);
                        auVar136 = vblendvps_avx(auVar88,auVar83,auVar137);
                        auVar83 = vblendvps_avx(auVar83,auVar88,auVar137);
                        auVar88 = vpcmpgtd_avx(auVar108,auVar103);
                        auVar137 = vpshufd_avx(auVar88,0xaa);
                        auVar88 = vblendvps_avx(auVar108,auVar103,auVar137);
                        auVar108 = vblendvps_avx(auVar103,auVar108,auVar137);
                        auVar103 = vpcmpgtd_avx(auVar136,auVar108);
                        auVar137 = vpshufd_avx(auVar103,0xaa);
                        auVar103 = vblendvps_avx(auVar136,auVar108,auVar137);
                        auVar108 = vblendvps_avx(auVar108,auVar136,auVar137);
                        *local_28c0 = auVar83;
                        local_28c0[1] = auVar108;
                        local_28c0[2] = auVar103;
                        uVar76 = auVar88._0_8_;
                        local_28c0 = local_28c0 + 3;
                      }
                      else {
                        *local_28c0 = auVar83;
                        local_28c0[1] = auVar108;
                        local_28c0[2] = auVar88;
                        local_28c0[3] = auVar136;
                        lVar72 = 0x30;
                        do {
                          lVar69 = lVar72;
                          lVar72 = 0;
                          if (uVar71 != 0) {
                            for (; (uVar71 >> lVar72 & 1) == 0; lVar72 = lVar72 + 1) {
                            }
                          }
                          auVar82._8_8_ = 0;
                          auVar82._0_8_ = *(ulong *)(uVar75 + lVar72 * 8);
                          auVar83 = vpunpcklqdq_avx(auVar82,ZEXT416(*(uint *)(local_27e0 +
                                                                             lVar72 * 4)));
                          *(undefined1 (*) [16])(local_28c0[1] + lVar69) = auVar83;
                          uVar71 = uVar71 & uVar71 - 1;
                          lVar72 = lVar69 + 0x10;
                        } while (uVar71 != 0);
                        pauVar61 = (undefined1 (*) [16])(local_28c0[1] + lVar69);
                        if (lVar69 + 0x10 != 0) {
                          lVar72 = 0x10;
                          pauVar67 = local_28c0;
                          do {
                            auVar83 = pauVar67[1];
                            uVar64 = *(uint *)(pauVar67[1] + 8);
                            pauVar67 = pauVar67 + 1;
                            lVar69 = lVar72;
                            do {
                              if (uVar64 <= *(uint *)(local_28c0[-1] + lVar69 + 8)) {
                                pauVar70 = (undefined1 (*) [16])(*local_28c0 + lVar69);
                                break;
                              }
                              *(undefined1 (*) [16])(*local_28c0 + lVar69) =
                                   *(undefined1 (*) [16])(local_28c0[-1] + lVar69);
                              lVar69 = lVar69 + -0x10;
                              pauVar70 = local_28c0;
                            } while (lVar69 != 0);
                            *pauVar70 = auVar83;
                            lVar72 = lVar72 + 0x10;
                          } while (pauVar61 != pauVar67);
                        }
                        uVar76 = *(ulong *)*pauVar61;
                        local_28c0 = pauVar61;
                      }
                    }
                  }
                }
              }
            }
            else {
              iVar62 = 6;
            }
          } while (iVar62 == 0);
        } while (iVar62 != 6);
        local_28b8 = (ulong)((uint)uVar76 & 0xf) - 8;
        if (local_28b8 != 0) {
          uVar76 = uVar76 & 0xfffffffffffffff0;
          lVar72 = 0;
          local_2918 = unaff_R13;
          do {
            lVar66 = lVar72 * 0x60;
            ppfVar3 = (context->scene->vertices).items;
            pfVar4 = ppfVar3[*(uint *)(uVar76 + 0x40 + lVar66)];
            pfVar5 = ppfVar3[*(uint *)(uVar76 + 0x44 + lVar66)];
            pfVar6 = ppfVar3[*(uint *)(uVar76 + 0x48 + lVar66)];
            pfVar7 = ppfVar3[*(uint *)(uVar76 + 0x4c + lVar66)];
            auVar88 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar76 + lVar66)),
                                    *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar76 + 8 + lVar66)))
            ;
            auVar83 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar76 + lVar66)),
                                    *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar76 + 8 + lVar66)))
            ;
            auVar136 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar76 + 4 + lVar66))
                                     ,*(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar76 + 0xc + lVar66)));
            auVar108 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar76 + 4 + lVar66))
                                     ,*(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar76 + 0xc + lVar66)));
            auVar137 = vunpcklps_avx(auVar83,auVar108);
            auVar105 = vunpcklps_avx(auVar88,auVar136);
            auVar83 = vunpckhps_avx(auVar88,auVar136);
            auVar136 = vunpcklps_avx(*(undefined1 (*) [16])
                                      (pfVar4 + *(uint *)(uVar76 + 0x10 + lVar66)),
                                     *(undefined1 (*) [16])
                                      (pfVar6 + *(uint *)(uVar76 + 0x18 + lVar66)));
            auVar108 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar4 + *(uint *)(uVar76 + 0x10 + lVar66)),
                                     *(undefined1 (*) [16])
                                      (pfVar6 + *(uint *)(uVar76 + 0x18 + lVar66)));
            auVar103 = vunpcklps_avx(*(undefined1 (*) [16])
                                      (pfVar5 + *(uint *)(uVar76 + 0x14 + lVar66)),
                                     *(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar76 + 0x1c + lVar66)));
            auVar88 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar76 + 0x14 + lVar66)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar76 + 0x1c + lVar66)));
            auVar106 = vunpcklps_avx(auVar108,auVar88);
            auVar122 = vunpcklps_avx(auVar136,auVar103);
            auVar108 = vunpckhps_avx(auVar136,auVar103);
            auVar103 = vunpcklps_avx(*(undefined1 (*) [16])
                                      (pfVar4 + *(uint *)(uVar76 + 0x20 + lVar66)),
                                     *(undefined1 (*) [16])
                                      (pfVar6 + *(uint *)(uVar76 + 0x28 + lVar66)));
            auVar88 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar4 + *(uint *)(uVar76 + 0x20 + lVar66)),
                                    *(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar76 + 0x28 + lVar66)));
            auVar138 = vunpcklps_avx(*(undefined1 (*) [16])
                                      (pfVar5 + *(uint *)(uVar76 + 0x24 + lVar66)),
                                     *(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar76 + 0x2c + lVar66)));
            auVar136 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar5 + *(uint *)(uVar76 + 0x24 + lVar66)),
                                     *(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar76 + 0x2c + lVar66)));
            auVar150 = vunpcklps_avx(auVar88,auVar136);
            auVar151 = vunpcklps_avx(auVar103,auVar138);
            auVar88 = vunpckhps_avx(auVar103,auVar138);
            auVar138 = vunpcklps_avx(*(undefined1 (*) [16])
                                      (pfVar4 + *(uint *)(uVar76 + 0x30 + lVar66)),
                                     *(undefined1 (*) [16])
                                      (pfVar6 + *(uint *)(uVar76 + 0x38 + lVar66)));
            auVar136 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar4 + *(uint *)(uVar76 + 0x30 + lVar66)),
                                     *(undefined1 (*) [16])
                                      (pfVar6 + *(uint *)(uVar76 + 0x38 + lVar66)));
            auVar162 = vunpcklps_avx(*(undefined1 (*) [16])
                                      (pfVar5 + *(uint *)(uVar76 + 0x34 + lVar66)),
                                     *(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar76 + 0x3c + lVar66)));
            auVar103 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar5 + *(uint *)(uVar76 + 0x34 + lVar66)),
                                     *(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar76 + 0x3c + lVar66)));
            auVar103 = vunpcklps_avx(auVar136,auVar103);
            auVar168 = vunpcklps_avx(auVar138,auVar162);
            lVar69 = uVar76 + 0x40 + lVar66;
            local_23c0 = *(undefined8 *)(lVar69 + 0x10);
            uStack_23b8 = *(undefined8 *)(lVar69 + 0x18);
            auVar136 = vunpckhps_avx(auVar138,auVar162);
            uStack_23b0 = local_23c0;
            uStack_23a8 = uStack_23b8;
            lVar66 = uVar76 + 0x50 + lVar66;
            local_2800 = *(undefined8 *)(lVar66 + 0x10);
            uStack_27f8 = *(undefined8 *)(lVar66 + 0x18);
            uStack_27f0 = local_2800;
            uStack_27e8 = uStack_27f8;
            auVar141._16_16_ = auVar151;
            auVar141._0_16_ = auVar105;
            auVar164._16_16_ = auVar88;
            auVar164._0_16_ = auVar83;
            auVar235._16_16_ = auVar150;
            auVar235._0_16_ = auVar137;
            auVar125._16_16_ = auVar122;
            auVar125._0_16_ = auVar122;
            auVar231._16_16_ = auVar108;
            auVar231._0_16_ = auVar108;
            auVar91._16_16_ = auVar106;
            auVar91._0_16_ = auVar106;
            auVar189._16_16_ = auVar168;
            auVar189._0_16_ = auVar168;
            auVar171._16_16_ = auVar136;
            auVar171._0_16_ = auVar136;
            auVar202._16_16_ = auVar103;
            auVar202._0_16_ = auVar103;
            uVar77 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar206._4_4_ = uVar77;
            auVar206._0_4_ = uVar77;
            auVar206._8_4_ = uVar77;
            auVar206._12_4_ = uVar77;
            auVar206._16_4_ = uVar77;
            auVar206._20_4_ = uVar77;
            auVar206._24_4_ = uVar77;
            auVar206._28_4_ = uVar77;
            uVar77 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar215._4_4_ = uVar77;
            auVar215._0_4_ = uVar77;
            auVar215._8_4_ = uVar77;
            auVar215._12_4_ = uVar77;
            auVar215._16_4_ = uVar77;
            auVar215._20_4_ = uVar77;
            auVar215._24_4_ = uVar77;
            auVar215._28_4_ = uVar77;
            uVar77 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar229._4_4_ = uVar77;
            auVar229._0_4_ = uVar77;
            auVar229._8_4_ = uVar77;
            auVar229._12_4_ = uVar77;
            auVar229._16_4_ = uVar77;
            auVar229._20_4_ = uVar77;
            auVar229._24_4_ = uVar77;
            auVar229._28_4_ = uVar77;
            local_23e0 = vsubps_avx(auVar141,auVar206);
            local_2400 = vsubps_avx(auVar164,auVar215);
            local_2420 = vsubps_avx(auVar235,auVar229);
            auVar109 = vsubps_avx(auVar125,auVar206);
            auVar18 = vsubps_avx(auVar231,auVar215);
            auVar21 = vsubps_avx(auVar91,auVar229);
            auVar22 = vsubps_avx(auVar189,auVar206);
            auVar23 = vsubps_avx(auVar171,auVar215);
            auVar24 = vsubps_avx(auVar202,auVar229);
            local_2440 = vsubps_avx(auVar22,local_23e0);
            local_2460 = vsubps_avx(auVar23,local_2400);
            local_2480 = vsubps_avx(auVar24,local_2420);
            fVar19 = local_2400._0_4_;
            fVar121 = auVar23._0_4_ + fVar19;
            fVar11 = local_2400._4_4_;
            fVar128 = auVar23._4_4_ + fVar11;
            fVar13 = local_2400._8_4_;
            fVar129 = auVar23._8_4_ + fVar13;
            fVar95 = local_2400._12_4_;
            fVar130 = auVar23._12_4_ + fVar95;
            fVar98 = local_2400._16_4_;
            fVar131 = auVar23._16_4_ + fVar98;
            fVar14 = local_2400._20_4_;
            fVar132 = auVar23._20_4_ + fVar14;
            fVar16 = local_2400._24_4_;
            fVar133 = auVar23._24_4_ + fVar16;
            fVar80 = local_2400._28_4_;
            fVar233 = local_2420._0_4_;
            fVar134 = fVar233 + auVar24._0_4_;
            fVar237 = local_2420._4_4_;
            fVar142 = fVar237 + auVar24._4_4_;
            fVar239 = local_2420._8_4_;
            fVar144 = fVar239 + auVar24._8_4_;
            fVar241 = local_2420._12_4_;
            fVar145 = fVar241 + auVar24._12_4_;
            fVar243 = local_2420._16_4_;
            fVar146 = fVar243 + auVar24._16_4_;
            fVar245 = local_2420._20_4_;
            fVar147 = fVar245 + auVar24._20_4_;
            fVar247 = local_2420._24_4_;
            fVar148 = fVar247 + auVar24._24_4_;
            fVar97 = local_2420._28_4_;
            fVar149 = local_2480._0_4_;
            fVar156 = local_2480._4_4_;
            auVar26._4_4_ = fVar156 * fVar128;
            auVar26._0_4_ = fVar149 * fVar121;
            fVar157 = local_2480._8_4_;
            auVar26._8_4_ = fVar157 * fVar129;
            fVar158 = local_2480._12_4_;
            auVar26._12_4_ = fVar158 * fVar130;
            fVar159 = local_2480._16_4_;
            auVar26._16_4_ = fVar159 * fVar131;
            fVar160 = local_2480._20_4_;
            auVar26._20_4_ = fVar160 * fVar132;
            fVar161 = local_2480._24_4_;
            auVar26._24_4_ = fVar161 * fVar133;
            auVar26._28_4_ = auVar136._12_4_;
            fVar213 = local_2460._0_4_;
            fVar217 = local_2460._4_4_;
            auVar27._4_4_ = fVar217 * fVar142;
            auVar27._0_4_ = fVar213 * fVar134;
            fVar219 = local_2460._8_4_;
            auVar27._8_4_ = fVar219 * fVar144;
            fVar221 = local_2460._12_4_;
            auVar27._12_4_ = fVar221 * fVar145;
            fVar223 = local_2460._16_4_;
            auVar27._16_4_ = fVar223 * fVar146;
            fVar225 = local_2460._20_4_;
            auVar27._20_4_ = fVar225 * fVar147;
            fVar227 = local_2460._24_4_;
            auVar27._24_4_ = fVar227 * fVar148;
            auVar27._28_4_ = auVar168._12_4_;
            auVar25 = vsubps_avx(auVar27,auVar26);
            fVar20 = local_23e0._0_4_;
            fVar184 = auVar22._0_4_ + fVar20;
            fVar12 = local_23e0._4_4_;
            fVar191 = auVar22._4_4_ + fVar12;
            fVar94 = local_23e0._8_4_;
            fVar192 = auVar22._8_4_ + fVar94;
            fVar96 = local_23e0._12_4_;
            fVar193 = auVar22._12_4_ + fVar96;
            fVar100 = local_23e0._16_4_;
            fVar194 = auVar22._16_4_ + fVar100;
            fVar15 = local_23e0._20_4_;
            fVar195 = auVar22._20_4_ + fVar15;
            fVar17 = local_23e0._24_4_;
            fVar196 = auVar22._24_4_ + fVar17;
            fVar204 = local_2440._0_4_;
            fVar207 = local_2440._4_4_;
            auVar28._4_4_ = fVar207 * fVar142;
            auVar28._0_4_ = fVar204 * fVar134;
            fVar208 = local_2440._8_4_;
            auVar28._8_4_ = fVar208 * fVar144;
            fVar209 = local_2440._12_4_;
            auVar28._12_4_ = fVar209 * fVar145;
            fVar210 = local_2440._16_4_;
            auVar28._16_4_ = fVar210 * fVar146;
            fVar211 = local_2440._20_4_;
            auVar28._20_4_ = fVar211 * fVar147;
            fVar212 = local_2440._24_4_;
            auVar28._24_4_ = fVar212 * fVar148;
            auVar28._28_4_ = fVar97 + auVar24._28_4_;
            auVar110 = local_2480;
            auVar29._4_4_ = fVar191 * fVar156;
            auVar29._0_4_ = fVar184 * fVar149;
            auVar29._8_4_ = fVar192 * fVar157;
            auVar29._12_4_ = fVar193 * fVar158;
            auVar29._16_4_ = fVar194 * fVar159;
            auVar29._20_4_ = fVar195 * fVar160;
            auVar29._24_4_ = fVar196 * fVar161;
            auVar29._28_4_ = auVar103._12_4_;
            auVar84 = vsubps_avx(auVar29,auVar28);
            auVar30._4_4_ = fVar217 * fVar191;
            auVar30._0_4_ = fVar213 * fVar184;
            auVar30._8_4_ = fVar219 * fVar192;
            auVar30._12_4_ = fVar221 * fVar193;
            auVar30._16_4_ = fVar223 * fVar194;
            auVar30._20_4_ = fVar225 * fVar195;
            auVar30._24_4_ = fVar227 * fVar196;
            auVar30._28_4_ = auVar22._28_4_ + local_23e0._28_4_;
            auVar31._4_4_ = fVar207 * fVar128;
            auVar31._0_4_ = fVar204 * fVar121;
            auVar31._8_4_ = fVar208 * fVar129;
            auVar31._12_4_ = fVar209 * fVar130;
            auVar31._16_4_ = fVar210 * fVar131;
            auVar31._20_4_ = fVar211 * fVar132;
            auVar31._24_4_ = fVar212 * fVar133;
            auVar31._28_4_ = auVar23._28_4_ + fVar80;
            auVar90 = vsubps_avx(auVar31,auVar30);
            fVar121 = (ray->super_RayK<1>).dir.field_0.m128[1];
            local_28e0._4_4_ = fVar121;
            local_28e0._0_4_ = fVar121;
            local_28e0._8_4_ = fVar121;
            local_28e0._12_4_ = fVar121;
            local_28e0._16_4_ = fVar121;
            local_28e0._20_4_ = fVar121;
            local_28e0._24_4_ = fVar121;
            local_28e0._28_4_ = fVar121;
            fVar128 = (ray->super_RayK<1>).dir.field_0.m128[2];
            local_2840._4_4_ = fVar128;
            local_2840._0_4_ = fVar128;
            local_2840._8_4_ = fVar128;
            local_2840._12_4_ = fVar128;
            local_2840._16_4_ = fVar128;
            local_2840._20_4_ = fVar128;
            local_2840._24_4_ = fVar128;
            local_2840._28_4_ = fVar128;
            local_2860._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar198 = local_2860._4_4_ * auVar25._0_4_ +
                      fVar121 * auVar84._0_4_ + fVar128 * auVar90._0_4_;
            fVar203 = local_2860._4_4_ * auVar25._4_4_ +
                      fVar121 * auVar84._4_4_ + fVar128 * auVar90._4_4_;
            local_24e0._0_8_ = CONCAT44(fVar203,fVar198);
            local_24e0._8_4_ =
                 local_2860._4_4_ * auVar25._8_4_ +
                 fVar121 * auVar84._8_4_ + fVar128 * auVar90._8_4_;
            local_24e0._12_4_ =
                 local_2860._4_4_ * auVar25._12_4_ +
                 fVar121 * auVar84._12_4_ + fVar128 * auVar90._12_4_;
            local_24e0._16_4_ =
                 local_2860._4_4_ * auVar25._16_4_ +
                 fVar121 * auVar84._16_4_ + fVar128 * auVar90._16_4_;
            local_24e0._20_4_ =
                 local_2860._4_4_ * auVar25._20_4_ +
                 fVar121 * auVar84._20_4_ + fVar128 * auVar90._20_4_;
            local_24e0._24_4_ =
                 local_2860._4_4_ * auVar25._24_4_ +
                 fVar121 * auVar84._24_4_ + fVar128 * auVar90._24_4_;
            local_24e0._28_4_ = auVar84._28_4_ + auVar84._28_4_ + auVar90._28_4_;
            local_24a0 = vsubps_avx(local_2400,auVar18);
            local_24c0 = vsubps_avx(local_2420,auVar21);
            fVar130 = fVar19 + auVar18._0_4_;
            fVar131 = fVar11 + auVar18._4_4_;
            fVar132 = fVar13 + auVar18._8_4_;
            fVar133 = fVar95 + auVar18._12_4_;
            fVar134 = fVar98 + auVar18._16_4_;
            fVar142 = fVar14 + auVar18._20_4_;
            fVar144 = fVar16 + auVar18._24_4_;
            fVar129 = auVar18._28_4_;
            fVar145 = fVar233 + auVar21._0_4_;
            fVar146 = fVar237 + auVar21._4_4_;
            fVar147 = fVar239 + auVar21._8_4_;
            fVar148 = fVar241 + auVar21._12_4_;
            fVar184 = fVar243 + auVar21._16_4_;
            fVar191 = fVar245 + auVar21._20_4_;
            fVar192 = fVar247 + auVar21._24_4_;
            fVar214 = local_24c0._0_4_;
            fVar218 = local_24c0._4_4_;
            auVar32._4_4_ = fVar218 * fVar131;
            auVar32._0_4_ = fVar214 * fVar130;
            fVar220 = local_24c0._8_4_;
            auVar32._8_4_ = fVar220 * fVar132;
            fVar222 = local_24c0._12_4_;
            auVar32._12_4_ = fVar222 * fVar133;
            fVar224 = local_24c0._16_4_;
            auVar32._16_4_ = fVar224 * fVar134;
            fVar226 = local_24c0._20_4_;
            auVar32._20_4_ = fVar226 * fVar142;
            fVar228 = local_24c0._24_4_;
            auVar32._24_4_ = fVar228 * fVar144;
            auVar32._28_4_ = fVar97;
            fVar166 = local_24a0._0_4_;
            fVar172 = local_24a0._4_4_;
            auVar33._4_4_ = fVar172 * fVar146;
            auVar33._0_4_ = fVar166 * fVar145;
            fVar174 = local_24a0._8_4_;
            auVar33._8_4_ = fVar174 * fVar147;
            fVar176 = local_24a0._12_4_;
            auVar33._12_4_ = fVar176 * fVar148;
            fVar178 = local_24a0._16_4_;
            auVar33._16_4_ = fVar178 * fVar184;
            fVar180 = local_24a0._20_4_;
            auVar33._20_4_ = fVar180 * fVar191;
            fVar182 = local_24a0._24_4_;
            auVar33._24_4_ = fVar182 * fVar192;
            auVar33._28_4_ = fVar80;
            auVar25 = vsubps_avx(auVar33,auVar32);
            auVar84 = vsubps_avx(local_23e0,auVar109);
            fVar234 = auVar84._0_4_;
            fVar238 = auVar84._4_4_;
            auVar34._4_4_ = fVar238 * fVar146;
            auVar34._0_4_ = fVar234 * fVar145;
            fVar240 = auVar84._8_4_;
            auVar34._8_4_ = fVar240 * fVar147;
            fVar242 = auVar84._12_4_;
            auVar34._12_4_ = fVar242 * fVar148;
            fVar244 = auVar84._16_4_;
            auVar34._16_4_ = fVar244 * fVar184;
            fVar246 = auVar84._20_4_;
            auVar34._20_4_ = fVar246 * fVar191;
            fVar248 = auVar84._24_4_;
            auVar34._24_4_ = fVar248 * fVar192;
            auVar34._28_4_ = fVar97 + auVar21._28_4_;
            fVar145 = fVar20 + auVar109._0_4_;
            fVar146 = fVar12 + auVar109._4_4_;
            fVar147 = fVar94 + auVar109._8_4_;
            fVar148 = fVar96 + auVar109._12_4_;
            fVar184 = fVar100 + auVar109._16_4_;
            fVar191 = fVar15 + auVar109._20_4_;
            fVar192 = fVar17 + auVar109._24_4_;
            fVar197 = local_23e0._28_4_ + auVar109._28_4_;
            auVar35._4_4_ = fVar218 * fVar146;
            auVar35._0_4_ = fVar214 * fVar145;
            auVar35._8_4_ = fVar220 * fVar147;
            auVar35._12_4_ = fVar222 * fVar148;
            auVar35._16_4_ = fVar224 * fVar184;
            auVar35._20_4_ = fVar226 * fVar191;
            auVar35._24_4_ = fVar228 * fVar192;
            auVar35._28_4_ = local_24c0._28_4_;
            auVar84 = vsubps_avx(auVar35,auVar34);
            auVar36._4_4_ = fVar172 * fVar146;
            auVar36._0_4_ = fVar166 * fVar145;
            auVar36._8_4_ = fVar174 * fVar147;
            auVar36._12_4_ = fVar176 * fVar148;
            auVar36._16_4_ = fVar178 * fVar184;
            auVar36._20_4_ = fVar180 * fVar191;
            auVar36._24_4_ = fVar182 * fVar192;
            auVar36._28_4_ = fVar197;
            auVar37._4_4_ = fVar238 * fVar131;
            auVar37._0_4_ = fVar234 * fVar130;
            auVar37._8_4_ = fVar240 * fVar132;
            auVar37._12_4_ = fVar242 * fVar133;
            auVar37._16_4_ = fVar244 * fVar134;
            auVar37._20_4_ = fVar246 * fVar142;
            auVar37._24_4_ = fVar248 * fVar144;
            auVar37._28_4_ = fVar80 + fVar129;
            auVar90 = vsubps_avx(auVar37,auVar36);
            local_27c0._0_4_ =
                 local_2860._4_4_ * auVar25._0_4_ +
                 fVar121 * auVar84._0_4_ + fVar128 * auVar90._0_4_;
            local_27c0._4_4_ =
                 local_2860._4_4_ * auVar25._4_4_ +
                 fVar121 * auVar84._4_4_ + fVar128 * auVar90._4_4_;
            local_27c0._8_4_ =
                 local_2860._4_4_ * auVar25._8_4_ +
                 fVar121 * auVar84._8_4_ + fVar128 * auVar90._8_4_;
            local_27c0._12_4_ =
                 local_2860._4_4_ * auVar25._12_4_ +
                 fVar121 * auVar84._12_4_ + fVar128 * auVar90._12_4_;
            local_27c0._16_4_ =
                 local_2860._4_4_ * auVar25._16_4_ +
                 fVar121 * auVar84._16_4_ + fVar128 * auVar90._16_4_;
            local_27c0._20_4_ =
                 local_2860._4_4_ * auVar25._20_4_ +
                 fVar121 * auVar84._20_4_ + fVar128 * auVar90._20_4_;
            local_27c0._24_4_ =
                 local_2860._4_4_ * auVar25._24_4_ +
                 fVar121 * auVar84._24_4_ + fVar128 * auVar90._24_4_;
            local_27c0._28_4_ = auVar25._28_4_ + auVar84._28_4_ + auVar90._28_4_;
            auVar25 = vsubps_avx(auVar109,auVar22);
            fVar192 = auVar109._0_4_ + auVar22._0_4_;
            fVar193 = auVar109._4_4_ + auVar22._4_4_;
            fVar194 = auVar109._8_4_ + auVar22._8_4_;
            fVar195 = auVar109._12_4_ + auVar22._12_4_;
            fVar196 = auVar109._16_4_ + auVar22._16_4_;
            fVar97 = auVar109._20_4_ + auVar22._20_4_;
            fVar99 = auVar109._24_4_ + auVar22._24_4_;
            fVar101 = auVar109._28_4_ + auVar22._28_4_;
            auVar109 = vsubps_avx(auVar18,auVar23);
            fVar144 = auVar18._0_4_ + auVar23._0_4_;
            fVar145 = auVar18._4_4_ + auVar23._4_4_;
            fVar146 = auVar18._8_4_ + auVar23._8_4_;
            fVar147 = auVar18._12_4_ + auVar23._12_4_;
            fVar148 = auVar18._16_4_ + auVar23._16_4_;
            fVar184 = auVar18._20_4_ + auVar23._20_4_;
            fVar191 = auVar18._24_4_ + auVar23._24_4_;
            auVar22 = vsubps_avx(auVar21,auVar24);
            fVar102 = auVar21._0_4_ + auVar24._0_4_;
            fVar115 = auVar21._4_4_ + auVar24._4_4_;
            fVar116 = auVar21._8_4_ + auVar24._8_4_;
            fVar117 = auVar21._12_4_ + auVar24._12_4_;
            fVar118 = auVar21._16_4_ + auVar24._16_4_;
            fVar119 = auVar21._20_4_ + auVar24._20_4_;
            fVar120 = auVar21._24_4_ + auVar24._24_4_;
            fVar80 = auVar22._0_4_;
            fVar130 = auVar22._4_4_;
            auVar38._4_4_ = fVar130 * fVar145;
            auVar38._0_4_ = fVar80 * fVar144;
            fVar131 = auVar22._8_4_;
            auVar38._8_4_ = fVar131 * fVar146;
            fVar132 = auVar22._12_4_;
            auVar38._12_4_ = fVar132 * fVar147;
            fVar133 = auVar22._16_4_;
            auVar38._16_4_ = fVar133 * fVar148;
            fVar134 = auVar22._20_4_;
            auVar38._20_4_ = fVar134 * fVar184;
            fVar142 = auVar22._24_4_;
            auVar38._24_4_ = fVar142 * fVar191;
            auVar38._28_4_ = fVar129;
            fVar167 = auVar109._0_4_;
            fVar173 = auVar109._4_4_;
            auVar39._4_4_ = fVar173 * fVar115;
            auVar39._0_4_ = fVar167 * fVar102;
            fVar175 = auVar109._8_4_;
            auVar39._8_4_ = fVar175 * fVar116;
            fVar177 = auVar109._12_4_;
            auVar39._12_4_ = fVar177 * fVar117;
            fVar179 = auVar109._16_4_;
            auVar39._16_4_ = fVar179 * fVar118;
            fVar181 = auVar109._20_4_;
            auVar39._20_4_ = fVar181 * fVar119;
            fVar183 = auVar109._24_4_;
            auVar39._24_4_ = fVar183 * fVar120;
            auVar39._28_4_ = fVar197;
            auVar109 = vsubps_avx(auVar39,auVar38);
            fVar135 = auVar25._0_4_;
            fVar143 = auVar25._4_4_;
            auVar40._4_4_ = fVar143 * fVar115;
            auVar40._0_4_ = fVar135 * fVar102;
            fVar102 = auVar25._8_4_;
            auVar40._8_4_ = fVar102 * fVar116;
            fVar115 = auVar25._12_4_;
            auVar40._12_4_ = fVar115 * fVar117;
            fVar116 = auVar25._16_4_;
            auVar40._16_4_ = fVar116 * fVar118;
            fVar117 = auVar25._20_4_;
            auVar40._20_4_ = fVar117 * fVar119;
            fVar118 = auVar25._24_4_;
            auVar40._24_4_ = fVar118 * fVar120;
            auVar40._28_4_ = auVar21._28_4_ + auVar24._28_4_;
            auVar41._4_4_ = fVar130 * fVar193;
            auVar41._0_4_ = fVar80 * fVar192;
            auVar41._8_4_ = fVar131 * fVar194;
            auVar41._12_4_ = fVar132 * fVar195;
            auVar41._16_4_ = fVar133 * fVar196;
            auVar41._20_4_ = fVar134 * fVar97;
            auVar41._24_4_ = fVar142 * fVar99;
            auVar41._28_4_ = fVar197;
            auVar18 = vsubps_avx(auVar41,auVar40);
            auVar42._4_4_ = fVar173 * fVar193;
            auVar42._0_4_ = fVar167 * fVar192;
            auVar42._8_4_ = fVar175 * fVar194;
            auVar42._12_4_ = fVar177 * fVar195;
            auVar42._16_4_ = fVar179 * fVar196;
            auVar42._20_4_ = fVar181 * fVar97;
            auVar42._24_4_ = fVar183 * fVar99;
            auVar42._28_4_ = fVar101;
            auVar43._4_4_ = fVar143 * fVar145;
            auVar43._0_4_ = fVar135 * fVar144;
            auVar43._8_4_ = fVar102 * fVar146;
            auVar43._12_4_ = fVar115 * fVar147;
            auVar43._16_4_ = fVar116 * fVar148;
            auVar43._20_4_ = fVar117 * fVar184;
            auVar43._24_4_ = fVar118 * fVar191;
            auVar43._28_4_ = fVar129 + auVar23._28_4_;
            auVar21 = vsubps_avx(auVar43,auVar42);
            local_2860._0_4_ = local_2860._4_4_;
            fStack_2858 = local_2860._4_4_;
            fStack_2854 = local_2860._4_4_;
            fStack_2850 = local_2860._4_4_;
            fStack_284c = local_2860._4_4_;
            fStack_2848 = local_2860._4_4_;
            fStack_2844 = local_2860._4_4_;
            auVar85._0_4_ =
                 local_2860._4_4_ * auVar109._0_4_ +
                 fVar121 * auVar18._0_4_ + fVar128 * auVar21._0_4_;
            auVar85._4_4_ =
                 local_2860._4_4_ * auVar109._4_4_ +
                 fVar121 * auVar18._4_4_ + fVar128 * auVar21._4_4_;
            auVar85._8_4_ =
                 local_2860._4_4_ * auVar109._8_4_ +
                 fVar121 * auVar18._8_4_ + fVar128 * auVar21._8_4_;
            auVar85._12_4_ =
                 local_2860._4_4_ * auVar109._12_4_ +
                 fVar121 * auVar18._12_4_ + fVar128 * auVar21._12_4_;
            auVar85._16_4_ =
                 local_2860._4_4_ * auVar109._16_4_ +
                 fVar121 * auVar18._16_4_ + fVar128 * auVar21._16_4_;
            auVar85._20_4_ =
                 local_2860._4_4_ * auVar109._20_4_ +
                 fVar121 * auVar18._20_4_ + fVar128 * auVar21._20_4_;
            auVar85._24_4_ =
                 local_2860._4_4_ * auVar109._24_4_ +
                 fVar121 * auVar18._24_4_ + fVar128 * auVar21._24_4_;
            auVar85._28_4_ = fVar101 + fVar101 + auVar21._28_4_;
            local_2520._0_4_ = auVar85._0_4_ + fVar198 + local_27c0._0_4_;
            local_2520._4_4_ = auVar85._4_4_ + fVar203 + local_27c0._4_4_;
            local_2520._8_4_ = auVar85._8_4_ + local_24e0._8_4_ + local_27c0._8_4_;
            local_2520._12_4_ = auVar85._12_4_ + local_24e0._12_4_ + local_27c0._12_4_;
            local_2520._16_4_ = auVar85._16_4_ + local_24e0._16_4_ + local_27c0._16_4_;
            local_2520._20_4_ = auVar85._20_4_ + local_24e0._20_4_ + local_27c0._20_4_;
            local_2520._24_4_ = auVar85._24_4_ + local_24e0._24_4_ + local_27c0._24_4_;
            local_2520._28_4_ = auVar85._28_4_ + local_24e0._28_4_ + local_27c0._28_4_;
            auVar109 = vminps_avx(local_24e0,local_27c0);
            auVar109 = vminps_avx(auVar109,auVar85);
            auVar111._8_4_ = 0x7fffffff;
            auVar111._0_8_ = 0x7fffffff7fffffff;
            auVar111._12_4_ = 0x7fffffff;
            auVar111._16_4_ = 0x7fffffff;
            auVar111._20_4_ = 0x7fffffff;
            auVar111._24_4_ = 0x7fffffff;
            auVar111._28_4_ = 0x7fffffff;
            local_2500 = vandps_avx(local_2520,auVar111);
            fVar129 = local_2500._0_4_ * 1.1920929e-07;
            fVar144 = local_2500._4_4_ * 1.1920929e-07;
            auVar44._4_4_ = fVar144;
            auVar44._0_4_ = fVar129;
            fVar145 = local_2500._8_4_ * 1.1920929e-07;
            auVar44._8_4_ = fVar145;
            fVar146 = local_2500._12_4_ * 1.1920929e-07;
            auVar44._12_4_ = fVar146;
            fVar147 = local_2500._16_4_ * 1.1920929e-07;
            auVar44._16_4_ = fVar147;
            fVar148 = local_2500._20_4_ * 1.1920929e-07;
            auVar44._20_4_ = fVar148;
            fVar184 = local_2500._24_4_ * 1.1920929e-07;
            auVar44._24_4_ = fVar184;
            auVar44._28_4_ = 0x34000000;
            auVar190._0_8_ = CONCAT44(fVar144,fVar129) ^ 0x8000000080000000;
            auVar190._8_4_ = -fVar145;
            auVar190._12_4_ = -fVar146;
            auVar190._16_4_ = -fVar147;
            auVar190._20_4_ = -fVar148;
            auVar190._24_4_ = -fVar184;
            auVar190._28_4_ = 0xb4000000;
            auVar109 = vcmpps_avx(auVar109,auVar190,5);
            auVar21 = vmaxps_avx(local_24e0,local_27c0);
            auVar18 = vmaxps_avx(auVar21,auVar85);
            auVar18 = vcmpps_avx(auVar18,auVar44,2);
            auVar18 = vorps_avx(auVar109,auVar18);
            if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar18 >> 0x7f,0) != '\0') ||
                  (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar18 >> 0xbf,0) != '\0') ||
                (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar18[0x1f] < '\0') {
              auVar45._4_4_ = fVar172 * fVar156;
              auVar45._0_4_ = fVar166 * fVar149;
              auVar45._8_4_ = fVar174 * fVar157;
              auVar45._12_4_ = fVar176 * fVar158;
              auVar45._16_4_ = fVar178 * fVar159;
              auVar45._20_4_ = fVar180 * fVar160;
              auVar45._24_4_ = fVar182 * fVar161;
              auVar45._28_4_ = auVar109._28_4_;
              auVar46._4_4_ = fVar218 * fVar217;
              auVar46._0_4_ = fVar214 * fVar213;
              auVar46._8_4_ = fVar220 * fVar219;
              auVar46._12_4_ = fVar222 * fVar221;
              auVar46._16_4_ = fVar224 * fVar223;
              auVar46._20_4_ = fVar226 * fVar225;
              auVar46._24_4_ = fVar228 * fVar227;
              auVar46._28_4_ = 0x34000000;
              auVar23 = vsubps_avx(auVar46,auVar45);
              auVar47._4_4_ = fVar218 * fVar173;
              auVar47._0_4_ = fVar214 * fVar167;
              auVar47._8_4_ = fVar220 * fVar175;
              auVar47._12_4_ = fVar222 * fVar177;
              auVar47._16_4_ = fVar224 * fVar179;
              auVar47._20_4_ = fVar226 * fVar181;
              auVar47._24_4_ = fVar228 * fVar183;
              auVar47._28_4_ = auVar21._28_4_;
              auVar48._4_4_ = fVar172 * fVar130;
              auVar48._0_4_ = fVar166 * fVar80;
              auVar48._8_4_ = fVar174 * fVar131;
              auVar48._12_4_ = fVar176 * fVar132;
              auVar48._16_4_ = fVar178 * fVar133;
              auVar48._20_4_ = fVar180 * fVar134;
              auVar48._24_4_ = fVar182 * fVar142;
              auVar48._28_4_ = local_27c0._28_4_;
              auVar24 = vsubps_avx(auVar48,auVar47);
              auVar126._8_4_ = 0x7fffffff;
              auVar126._0_8_ = 0x7fffffff7fffffff;
              auVar126._12_4_ = 0x7fffffff;
              auVar126._16_4_ = 0x7fffffff;
              auVar126._20_4_ = 0x7fffffff;
              auVar126._24_4_ = 0x7fffffff;
              auVar126._28_4_ = 0x7fffffff;
              auVar109 = vandps_avx(auVar45,auVar126);
              auVar21 = vandps_avx(auVar47,auVar126);
              auVar109 = vcmpps_avx(auVar109,auVar21,1);
              local_2780 = vblendvps_avx(auVar24,auVar23,auVar109);
              auVar49._4_4_ = fVar238 * fVar130;
              auVar49._0_4_ = fVar234 * fVar80;
              auVar49._8_4_ = fVar240 * fVar131;
              auVar49._12_4_ = fVar242 * fVar132;
              auVar49._16_4_ = fVar244 * fVar133;
              auVar49._20_4_ = fVar246 * fVar134;
              auVar49._24_4_ = fVar248 * fVar142;
              auVar49._28_4_ = auVar109._28_4_;
              auVar50._4_4_ = fVar238 * fVar156;
              auVar50._0_4_ = fVar234 * fVar149;
              auVar50._8_4_ = fVar240 * fVar157;
              auVar50._12_4_ = fVar242 * fVar158;
              auVar50._16_4_ = fVar244 * fVar159;
              auVar50._20_4_ = fVar246 * fVar160;
              auVar50._24_4_ = fVar248 * fVar161;
              auVar50._28_4_ = auVar23._28_4_;
              auVar51._4_4_ = fVar207 * fVar218;
              auVar51._0_4_ = fVar204 * fVar214;
              auVar51._8_4_ = fVar208 * fVar220;
              auVar51._12_4_ = fVar209 * fVar222;
              auVar51._16_4_ = fVar210 * fVar224;
              auVar51._20_4_ = fVar211 * fVar226;
              auVar51._24_4_ = fVar212 * fVar228;
              auVar51._28_4_ = local_2480._28_4_;
              auVar23 = vsubps_avx(auVar50,auVar51);
              auVar52._4_4_ = fVar218 * fVar143;
              auVar52._0_4_ = fVar214 * fVar135;
              auVar52._8_4_ = fVar220 * fVar102;
              auVar52._12_4_ = fVar222 * fVar115;
              auVar52._16_4_ = fVar224 * fVar116;
              auVar52._20_4_ = fVar226 * fVar117;
              auVar52._24_4_ = fVar228 * fVar118;
              auVar52._28_4_ = local_24c0._28_4_;
              auVar24 = vsubps_avx(auVar52,auVar49);
              auVar109 = vandps_avx(auVar51,auVar126);
              auVar21 = vandps_avx(auVar49,auVar126);
              auVar109 = vcmpps_avx(auVar109,auVar21,1);
              local_2760 = vblendvps_avx(auVar24,auVar23,auVar109);
              auVar53._4_4_ = fVar172 * fVar143;
              auVar53._0_4_ = fVar166 * fVar135;
              auVar53._8_4_ = fVar174 * fVar102;
              auVar53._12_4_ = fVar176 * fVar115;
              auVar53._16_4_ = fVar178 * fVar116;
              auVar53._20_4_ = fVar180 * fVar117;
              auVar53._24_4_ = fVar182 * fVar118;
              auVar53._28_4_ = auVar109._28_4_;
              auVar54._4_4_ = fVar207 * fVar172;
              auVar54._0_4_ = fVar204 * fVar166;
              auVar54._8_4_ = fVar208 * fVar174;
              auVar54._12_4_ = fVar209 * fVar176;
              auVar54._16_4_ = fVar210 * fVar178;
              auVar54._20_4_ = fVar211 * fVar180;
              auVar54._24_4_ = fVar212 * fVar182;
              auVar54._28_4_ = auVar23._28_4_;
              auVar55._4_4_ = fVar238 * fVar217;
              auVar55._0_4_ = fVar234 * fVar213;
              auVar55._8_4_ = fVar240 * fVar219;
              auVar55._12_4_ = fVar242 * fVar221;
              auVar55._16_4_ = fVar244 * fVar223;
              auVar55._20_4_ = fVar246 * fVar225;
              auVar55._24_4_ = fVar248 * fVar227;
              auVar55._28_4_ = auVar25._28_4_;
              auVar56._4_4_ = fVar238 * fVar173;
              auVar56._0_4_ = fVar234 * fVar167;
              auVar56._8_4_ = fVar240 * fVar175;
              auVar56._12_4_ = fVar242 * fVar177;
              auVar56._16_4_ = fVar244 * fVar179;
              auVar56._20_4_ = fVar246 * fVar181;
              auVar56._24_4_ = fVar248 * fVar183;
              auVar56._28_4_ = auVar22._28_4_;
              auVar22 = vsubps_avx(auVar54,auVar55);
              auVar23 = vsubps_avx(auVar56,auVar53);
              auVar109 = vandps_avx(auVar55,auVar126);
              auVar21 = vandps_avx(auVar53,auVar126);
              auVar109 = vcmpps_avx(auVar109,auVar21,1);
              local_2740 = vblendvps_avx(auVar23,auVar22,auVar109);
              auVar83 = vpackssdw_avx(auVar18._0_16_,auVar18._16_16_);
              fVar134 = local_2740._0_4_;
              fVar142 = local_2740._4_4_;
              fVar144 = local_2740._8_4_;
              fVar145 = local_2740._12_4_;
              fVar146 = local_2740._16_4_;
              fVar147 = local_2740._20_4_;
              fVar148 = local_2740._24_4_;
              fVar184 = local_2760._0_4_;
              fVar191 = local_2760._4_4_;
              fVar192 = local_2760._8_4_;
              fVar193 = local_2760._12_4_;
              fVar194 = local_2760._16_4_;
              fVar195 = local_2760._20_4_;
              fVar196 = local_2760._24_4_;
              fVar97 = local_2780._0_4_;
              fVar99 = local_2780._4_4_;
              fVar101 = local_2780._8_4_;
              fVar102 = local_2780._12_4_;
              fVar115 = local_2780._16_4_;
              fVar116 = local_2780._20_4_;
              fVar117 = local_2780._24_4_;
              fVar80 = fVar97 * local_2860._4_4_ + fVar184 * fVar121 + fVar134 * fVar128;
              fVar129 = fVar99 * local_2860._4_4_ + fVar191 * fVar121 + fVar142 * fVar128;
              fVar130 = fVar101 * local_2860._4_4_ + fVar192 * fVar121 + fVar144 * fVar128;
              fVar131 = fVar102 * local_2860._4_4_ + fVar193 * fVar121 + fVar145 * fVar128;
              fVar132 = fVar115 * local_2860._4_4_ + fVar194 * fVar121 + fVar146 * fVar128;
              fVar133 = fVar116 * local_2860._4_4_ + fVar195 * fVar121 + fVar147 * fVar128;
              fVar121 = fVar117 * local_2860._4_4_ + fVar196 * fVar121 + fVar148 * fVar128;
              fVar128 = auVar109._28_4_ + auVar109._28_4_ + auVar18._28_4_;
              auVar86._0_4_ = fVar80 + fVar80;
              auVar86._4_4_ = fVar129 + fVar129;
              auVar86._8_4_ = fVar130 + fVar130;
              auVar86._12_4_ = fVar131 + fVar131;
              auVar86._16_4_ = fVar132 + fVar132;
              auVar86._20_4_ = fVar133 + fVar133;
              auVar86._24_4_ = fVar121 + fVar121;
              auVar86._28_4_ = fVar128 + fVar128;
              auVar109 = vrcpps_avx(auVar86);
              fVar80 = fVar97 * fVar20 + fVar184 * fVar19 + fVar134 * fVar233;
              fVar129 = fVar99 * fVar12 + fVar191 * fVar11 + fVar142 * fVar237;
              fVar94 = fVar101 * fVar94 + fVar192 * fVar13 + fVar144 * fVar239;
              fVar95 = fVar102 * fVar96 + fVar193 * fVar95 + fVar145 * fVar241;
              fVar96 = fVar115 * fVar100 + fVar194 * fVar98 + fVar146 * fVar243;
              fVar98 = fVar116 * fVar15 + fVar195 * fVar14 + fVar147 * fVar245;
              fVar100 = fVar117 * fVar17 + fVar196 * fVar16 + fVar148 * fVar247;
              fVar121 = auVar109._0_4_;
              fVar128 = auVar109._4_4_;
              auVar57._4_4_ = auVar86._4_4_ * fVar128;
              auVar57._0_4_ = auVar86._0_4_ * fVar121;
              fVar19 = auVar109._8_4_;
              auVar57._8_4_ = auVar86._8_4_ * fVar19;
              fVar20 = auVar109._12_4_;
              auVar57._12_4_ = auVar86._12_4_ * fVar20;
              fVar11 = auVar109._16_4_;
              auVar57._16_4_ = auVar86._16_4_ * fVar11;
              fVar12 = auVar109._20_4_;
              auVar57._20_4_ = auVar86._20_4_ * fVar12;
              fVar13 = auVar109._24_4_;
              auVar57._24_4_ = auVar86._24_4_ * fVar13;
              auVar57._28_4_ = auVar22._28_4_;
              auVar127._8_4_ = 0x3f800000;
              auVar127._0_8_ = &DAT_3f8000003f800000;
              auVar127._12_4_ = 0x3f800000;
              auVar127._16_4_ = 0x3f800000;
              auVar127._20_4_ = 0x3f800000;
              auVar127._24_4_ = 0x3f800000;
              auVar127._28_4_ = 0x3f800000;
              auVar109 = vsubps_avx(auVar127,auVar57);
              uVar77 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar154._4_4_ = uVar77;
              auVar154._0_4_ = uVar77;
              auVar154._8_4_ = uVar77;
              auVar154._12_4_ = uVar77;
              auVar154._16_4_ = uVar77;
              auVar154._20_4_ = uVar77;
              auVar154._24_4_ = uVar77;
              auVar154._28_4_ = uVar77;
              local_28e0._4_4_ = (fVar129 + fVar129) * (fVar128 + fVar128 * auVar109._4_4_);
              local_28e0._0_4_ = (fVar80 + fVar80) * (fVar121 + fVar121 * auVar109._0_4_);
              local_28e0._8_4_ = (fVar94 + fVar94) * (fVar19 + fVar19 * auVar109._8_4_);
              local_28e0._12_4_ = (fVar95 + fVar95) * (fVar20 + fVar20 * auVar109._12_4_);
              local_28e0._16_4_ = (fVar96 + fVar96) * (fVar11 + fVar11 * auVar109._16_4_);
              local_28e0._20_4_ = (fVar98 + fVar98) * (fVar12 + fVar12 * auVar109._20_4_);
              local_28e0._24_4_ = (fVar100 + fVar100) * (fVar13 + fVar13 * auVar109._24_4_);
              local_28e0._28_4_ = local_27c0._28_4_;
              auVar109 = vcmpps_avx(auVar154,local_28e0,2);
              fVar121 = (ray->super_RayK<1>).tfar;
              auVar112._4_4_ = fVar121;
              auVar112._0_4_ = fVar121;
              auVar112._8_4_ = fVar121;
              auVar112._12_4_ = fVar121;
              auVar112._16_4_ = fVar121;
              auVar112._20_4_ = fVar121;
              auVar112._24_4_ = fVar121;
              auVar112._28_4_ = fVar121;
              auVar18 = vcmpps_avx(local_28e0,auVar112,2);
              auVar109 = vandps_avx(auVar18,auVar109);
              auVar21 = vcmpps_avx(auVar86,_DAT_02020f00,4);
              auVar109 = vandps_avx(auVar109,auVar21);
              auVar108 = vpackssdw_avx(auVar109._0_16_,auVar109._16_16_);
              auVar83 = vpand_avx(auVar108,auVar83);
              auVar108 = vpmovsxwd_avx(auVar83);
              auVar88 = vpshufd_avx(auVar83,0xee);
              auVar88 = vpmovsxwd_avx(auVar88);
              local_2720._16_16_ = auVar88;
              local_2720._0_16_ = auVar108;
              if ((((((((local_2720 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (local_2720 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_2720 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(local_2720 >> 0x7f,0) != '\0') ||
                    (local_2720 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB161(auVar88 >> 0x3f,0) != '\0') ||
                  (local_2720 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar88[0xf] < '\0') {
                local_27e0._8_4_ = local_24e0._8_4_;
                local_27e0._0_8_ = local_24e0._0_8_;
                fStack_27d4 = local_24e0._12_4_;
                fStack_27d0 = local_24e0._16_4_;
                fStack_27cc = local_24e0._20_4_;
                fStack_27c8 = local_24e0._24_4_;
                fStack_27c4 = local_24e0._28_4_;
                local_27a0 = local_2520;
                local_26c0 = local_28e0;
                local_2640._8_8_ = uStack_2598;
                local_2640._0_8_ = local_25a0;
                local_2640._16_8_ = uStack_2590;
                local_2640._24_8_ = uStack_2588;
                auVar109 = vrcpps_avx(local_2520);
                local_2820 = local_2720;
                fVar121 = auVar109._0_4_;
                fVar128 = auVar109._4_4_;
                auVar58._4_4_ = local_2520._4_4_ * fVar128;
                auVar58._0_4_ = local_2520._0_4_ * fVar121;
                fVar19 = auVar109._8_4_;
                auVar58._8_4_ = local_2520._8_4_ * fVar19;
                fVar20 = auVar109._12_4_;
                auVar58._12_4_ = local_2520._12_4_ * fVar20;
                fVar11 = auVar109._16_4_;
                auVar58._16_4_ = local_2520._16_4_ * fVar11;
                fVar12 = auVar109._20_4_;
                auVar58._20_4_ = local_2520._20_4_ * fVar12;
                fVar13 = auVar109._24_4_;
                auVar58._24_4_ = local_2520._24_4_ * fVar13;
                auVar58._28_4_ = auVar18._28_4_;
                auVar165._8_4_ = 0x3f800000;
                auVar165._0_8_ = &DAT_3f8000003f800000;
                auVar165._12_4_ = 0x3f800000;
                auVar165._16_4_ = 0x3f800000;
                auVar165._20_4_ = 0x3f800000;
                auVar165._24_4_ = 0x3f800000;
                auVar165._28_4_ = 0x3f800000;
                auVar18 = vsubps_avx(auVar165,auVar58);
                auVar92._0_4_ = fVar121 + fVar121 * auVar18._0_4_;
                auVar92._4_4_ = fVar128 + fVar128 * auVar18._4_4_;
                auVar92._8_4_ = fVar19 + fVar19 * auVar18._8_4_;
                auVar92._12_4_ = fVar20 + fVar20 * auVar18._12_4_;
                auVar92._16_4_ = fVar11 + fVar11 * auVar18._16_4_;
                auVar92._20_4_ = fVar12 + fVar12 * auVar18._20_4_;
                auVar92._24_4_ = fVar13 + fVar13 * auVar18._24_4_;
                auVar92._28_4_ = auVar109._28_4_ + auVar18._28_4_;
                auVar113._8_4_ = 0x219392ef;
                auVar113._0_8_ = 0x219392ef219392ef;
                auVar113._12_4_ = 0x219392ef;
                auVar113._16_4_ = 0x219392ef;
                auVar113._20_4_ = 0x219392ef;
                auVar113._24_4_ = 0x219392ef;
                auVar113._28_4_ = 0x219392ef;
                auVar18 = vcmpps_avx(local_2500,auVar113,5);
                auVar109 = vandps_avx(auVar18,auVar92);
                auVar59._4_4_ = fVar203 * auVar109._4_4_;
                auVar59._0_4_ = fVar198 * auVar109._0_4_;
                auVar59._8_4_ = local_24e0._8_4_ * auVar109._8_4_;
                auVar59._12_4_ = local_24e0._12_4_ * auVar109._12_4_;
                auVar59._16_4_ = local_24e0._16_4_ * auVar109._16_4_;
                auVar59._20_4_ = local_24e0._20_4_ * auVar109._20_4_;
                auVar59._24_4_ = local_24e0._24_4_ * auVar109._24_4_;
                auVar59._28_4_ = auVar18._28_4_;
                auVar18 = vminps_avx(auVar59,auVar165);
                auVar60._4_4_ = local_27c0._4_4_ * auVar109._4_4_;
                auVar60._0_4_ = local_27c0._0_4_ * auVar109._0_4_;
                auVar60._8_4_ = local_27c0._8_4_ * auVar109._8_4_;
                auVar60._12_4_ = local_27c0._12_4_ * auVar109._12_4_;
                auVar60._16_4_ = local_27c0._16_4_ * auVar109._16_4_;
                auVar60._20_4_ = local_27c0._20_4_ * auVar109._20_4_;
                auVar60._24_4_ = local_27c0._24_4_ * auVar109._24_4_;
                auVar60._28_4_ = auVar109._28_4_;
                auVar21 = vminps_avx(auVar60,auVar165);
                auVar22 = vsubps_avx(auVar165,auVar18);
                auVar155._8_4_ = 0xbf800000;
                auVar155._0_8_ = 0xbf800000bf800000;
                auVar155._12_4_ = 0xbf800000;
                auVar155._16_4_ = 0xbf800000;
                auVar155._20_4_ = 0xbf800000;
                auVar155._24_4_ = 0xbf800000;
                auVar155._28_4_ = 0xbf800000;
                auVar109 = vblendvps_avx(auVar165,auVar155,local_2640);
                local_26e0 = vblendvps_avx(auVar21,auVar22,local_2640);
                auVar21 = vsubps_avx(auVar165,auVar21);
                local_2700 = vblendvps_avx(auVar18,auVar21,local_2640);
                fVar121 = auVar109._0_4_;
                fVar128 = auVar109._4_4_;
                fVar19 = auVar109._8_4_;
                fVar20 = auVar109._12_4_;
                fVar11 = auVar109._16_4_;
                fVar12 = auVar109._20_4_;
                fVar13 = auVar109._24_4_;
                local_26a0[0] = fVar97 * fVar121;
                local_26a0[1] = fVar99 * fVar128;
                local_26a0[2] = fVar101 * fVar19;
                local_26a0[3] = fVar102 * fVar20;
                fStack_2690 = fVar115 * fVar11;
                fStack_268c = fVar116 * fVar12;
                fStack_2688 = fVar117 * fVar13;
                uStack_2684 = local_2700._28_4_;
                local_2680[0] = fVar184 * fVar121;
                local_2680[1] = fVar191 * fVar128;
                local_2680[2] = fVar192 * fVar19;
                local_2680[3] = fVar193 * fVar20;
                fStack_2670 = fVar194 * fVar11;
                fStack_266c = fVar195 * fVar12;
                fStack_2668 = fVar196 * fVar13;
                uStack_2664 = auVar18._28_4_;
                local_2660[0] = fVar121 * fVar134;
                local_2660[1] = fVar128 * fVar142;
                local_2660[2] = fVar19 * fVar144;
                local_2660[3] = fVar20 * fVar145;
                fStack_2650 = fVar11 * fVar146;
                fStack_264c = fVar12 * fVar147;
                fStack_2648 = fVar13 * fVar148;
                uStack_2644 = local_26e0._28_4_;
                auVar108 = vpmovzxwd_avx(auVar83);
                auVar93._0_16_ = vpslld_avx(auVar108,0x1f);
                auVar108 = vpunpckhwd_avx(auVar83,auVar83);
                auVar108 = vpslld_avx(auVar108,0x1f);
                auVar93._16_16_ = auVar108;
                auVar114._8_4_ = 0x7f800000;
                auVar114._0_8_ = 0x7f8000007f800000;
                auVar114._12_4_ = 0x7f800000;
                auVar114._16_4_ = 0x7f800000;
                auVar114._20_4_ = 0x7f800000;
                auVar114._24_4_ = 0x7f800000;
                auVar114._28_4_ = 0x7f800000;
                auVar109 = vblendvps_avx(auVar114,local_28e0,auVar93);
                auVar18 = vshufps_avx(auVar109,auVar109,0xb1);
                auVar18 = vminps_avx(auVar109,auVar18);
                auVar21 = vshufpd_avx(auVar18,auVar18,5);
                auVar18 = vminps_avx(auVar18,auVar21);
                auVar21 = vperm2f128_avx(auVar18,auVar18,1);
                auVar18 = vminps_avx(auVar18,auVar21);
                auVar109 = vcmpps_avx(auVar109,auVar18,0);
                auVar108 = vpackssdw_avx(auVar109._0_16_,auVar109._16_16_);
                auVar83 = vpand_avx(auVar108,auVar83);
                auVar108 = vpmovzxwd_avx(auVar83);
                auVar108 = vpslld_avx(auVar108,0x1f);
                auVar108 = vpsrad_avx(auVar108,0x1f);
                auVar83 = vpunpckhwd_avx(auVar83,auVar83);
                auVar83 = vpslld_avx(auVar83,0x1f);
                auVar83 = vpsrad_avx(auVar83,0x1f);
                auVar87._16_16_ = auVar83;
                auVar87._0_16_ = auVar108;
                if ((((((((auVar87 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar87 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar87 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar87 >> 0x7f,0) == '\0') &&
                      (auVar87 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB161(auVar83 >> 0x3f,0) == '\0') &&
                    (auVar87 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar83[0xf]) {
                  auVar87 = local_2720;
                }
                uVar63 = vmovmskps_avx(auVar87);
                uVar64 = 0;
                if (uVar63 != 0) {
                  for (; (uVar63 >> uVar64 & 1) == 0; uVar64 = uVar64 + 1) {
                  }
                }
                local_28b0 = context->scene;
                local_2480 = auVar110;
                do {
                  uVar75 = (ulong)uVar64;
                  uVar64 = *(uint *)((long)&local_23c0 + uVar75 * 4);
                  pGVar8 = (local_28b0->geometries).items[uVar64].ptr;
                  if ((pGVar8->mask & (ray->super_RayK<1>).mask) == 0) {
                    *(undefined4 *)(local_2820 + uVar75 * 4) = 0;
                  }
                  else {
                    pRVar9 = context->args;
                    if ((pRVar9->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      fVar121 = *(float *)(local_2700 + uVar75 * 4);
                      fVar128 = *(float *)(local_26e0 + uVar75 * 4);
                      (ray->super_RayK<1>).tfar = *(float *)(local_26c0 + uVar75 * 4);
                      (ray->Ng).field_0.field_0.x = local_26a0[uVar75];
                      (ray->Ng).field_0.field_0.y = local_2680[uVar75];
                      (ray->Ng).field_0.field_0.z = local_2660[uVar75];
                      ray->u = fVar121;
                      ray->v = fVar128;
                      ray->primID = *(uint *)((long)&local_2800 + uVar75 * 4);
                      ray->geomID = uVar64;
                      pRVar10 = context->user;
                      ray->instID[0] = pRVar10->instID[0];
                      ray->instPrimID[0] = pRVar10->instPrimID[0];
                      unaff_R13 = local_2918;
                      break;
                    }
                    local_2910.context = context->user;
                    local_2890 = local_26a0[uVar75];
                    local_288c = local_2680[uVar75];
                    local_2888 = local_2660[uVar75];
                    local_2884 = *(undefined4 *)(local_2700 + uVar75 * 4);
                    local_2880 = *(undefined4 *)(local_26e0 + uVar75 * 4);
                    local_287c = *(undefined4 *)((long)&local_2800 + uVar75 * 4);
                    local_2878 = uVar64;
                    local_2874 = (local_2910.context)->instID[0];
                    local_2870 = (local_2910.context)->instPrimID[0];
                    local_2840._0_4_ = (ray->super_RayK<1>).tfar;
                    (ray->super_RayK<1>).tfar = *(float *)(local_26c0 + uVar75 * 4);
                    local_291c = -1;
                    local_2910.valid = &local_291c;
                    local_2910.geometryUserPtr = pGVar8->userPtr;
                    local_2910.ray = (RTCRayN *)ray;
                    local_2910.hit = (RTCHitN *)&local_2890;
                    local_2910.N = 1;
                    if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_015c2cc1:
                      if (pRVar9->filter != (RTCFilterFunctionN)0x0) {
                        if (((pRVar9->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((pGVar8->field_8).field_0x2 & 0x40) != 0)) {
                          (*pRVar9->filter)(&local_2910);
                        }
                        if (*local_2910.valid == 0) goto LAB_015c2dbd;
                      }
                      (((Vec3f *)((long)local_2910.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_2910.hit;
                      (((Vec3f *)((long)local_2910.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_2910.hit + 4);
                      (((Vec3f *)((long)local_2910.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_2910.hit + 8);
                      *(float *)((long)local_2910.ray + 0x3c) = *(float *)(local_2910.hit + 0xc);
                      *(float *)((long)local_2910.ray + 0x40) = *(float *)(local_2910.hit + 0x10);
                      *(float *)((long)local_2910.ray + 0x44) = *(float *)(local_2910.hit + 0x14);
                      *(float *)((long)local_2910.ray + 0x48) = *(float *)(local_2910.hit + 0x18);
                      *(float *)((long)local_2910.ray + 0x4c) = *(float *)(local_2910.hit + 0x1c);
                      *(float *)((long)local_2910.ray + 0x50) = *(float *)(local_2910.hit + 0x20);
                    }
                    else {
                      local_2860 = lVar72;
                      (*pGVar8->intersectionFilterN)(&local_2910);
                      lVar72 = local_2860;
                      if (*local_2910.valid != 0) goto LAB_015c2cc1;
LAB_015c2dbd:
                      (ray->super_RayK<1>).tfar = (float)local_2840._0_4_;
                    }
                    *(undefined4 *)(local_2820 + uVar75 * 4) = 0;
                    fVar121 = (ray->super_RayK<1>).tfar;
                    auVar78._4_4_ = fVar121;
                    auVar78._0_4_ = fVar121;
                    auVar78._8_4_ = fVar121;
                    auVar78._12_4_ = fVar121;
                    auVar78._16_4_ = fVar121;
                    auVar78._20_4_ = fVar121;
                    auVar78._24_4_ = fVar121;
                    auVar78._28_4_ = fVar121;
                    auVar109 = vcmpps_avx(local_28e0,auVar78,2);
                    local_2820 = vandps_avx(auVar109,local_2820);
                    unaff_R13 = local_2918;
                  }
                  if ((((((((local_2820 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (local_2820 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_2820 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_2820 >> 0x7f,0) == '\0') &&
                        (local_2820 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_2820 >> 0xbf,0) == '\0') &&
                      (local_2820 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_2820[0x1f]) break;
                  BVHNIntersector1<8,1048576,false,embree::avx::ArrayIntersector1<embree::avx::QuadMiIntersector1Pluecker<4,true>>>
                  ::intersect(&local_2910);
                  uVar64 = (uint)local_2910.valid;
                } while( true );
              }
            }
            lVar72 = lVar72 + 1;
          } while (lVar72 != local_28b8);
        }
        fVar121 = (ray->super_RayK<1>).tfar;
        auVar79 = ZEXT3264(CONCAT428(fVar121,CONCAT424(fVar121,CONCAT420(fVar121,CONCAT416(fVar121,
                                                  CONCAT412(fVar121,CONCAT48(fVar121,CONCAT44(
                                                  fVar121,fVar121))))))));
        auVar216 = ZEXT3264(local_25c0);
        auVar230 = ZEXT3264(local_25e0);
        auVar232 = ZEXT3264(local_2600);
        auVar236 = ZEXT3264(local_2620);
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }